

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

void llvm::yaml::skip<llvm::yaml::MappingNode>(MappingNode *C)

{
  bool bVar1;
  KeyValueNode *this;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_20;
  iterator e;
  iterator i;
  MappingNode *C_local;
  
  if (((C->IsAtBeginning & 1U) != 0) || (bVar1 = false, (C->IsAtEnd & 1U) != 0)) {
    bVar1 = true;
  }
  if (bVar1) {
    if ((C->IsAtBeginning & 1U) != 0) {
      e = begin<llvm::yaml::MappingNode>(C);
      local_20.Base = (MappingNode *)MappingNode::end(C);
      while (bVar1 = basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator!=(&e,&local_20), bVar1) {
        this = basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
               operator->(&e);
        KeyValueNode::skip(this);
        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++(&e)
        ;
      }
    }
    return;
  }
  __assert_fail("(C.IsAtBeginning || C.IsAtEnd) && \"Cannot skip mid parse!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                ,0x186,
                "void llvm::yaml::skip(CollectionType &) [CollectionType = llvm::yaml::MappingNode]"
               );
}

Assistant:

void skip(CollectionType &C) {
  // TODO: support skipping from the middle of a parsed collection ;/
  assert((C.IsAtBeginning || C.IsAtEnd) && "Cannot skip mid parse!");
  if (C.IsAtBeginning)
    for (typename CollectionType::iterator i = begin(C), e = C.end(); i != e;
         ++i)
      i->skip();
}